

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Bmci(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint fVerbose;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  local_48 = 1000;
  local_44 = 1000;
  local_3c = 0;
  fVerbose = 0;
LAB_00232571:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"FWTsvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 < 0x54) {
      if (iVar2 == -1) {
        p = pAbc->pGia;
        if (p == (Gia_Man_t *)0x0) {
          pcVar4 = "Abc_CommandAbc9Bmci(): There is no AIG.\n";
        }
        else if (p->nRegs == 0) {
          pcVar4 = "Abc_CommandAbc9Bmci(): AIG is combinational.\n";
        }
        else {
          if (p->vInitClasses != (Vec_Int_t *)0x0) {
            Gia_ManBmciTest(p,p->vInitClasses,local_48,local_44,local_40,local_3c,fVerbose);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9Bmci(): Init array is not given.\n";
        }
        Abc_Print(-1,pcVar4);
        return 0;
      }
      if (iVar2 != 0x46) goto LAB_002326bb;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_002326af:
        Abc_Print(-1,pcVar4);
        goto LAB_002326bb;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_48 = uVar3;
    }
    else if (iVar2 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_002326af;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_40 = uVar3;
    }
    else {
      if (iVar2 != 0x57) {
        if (iVar2 != 0x73) goto LAB_002326bb;
        local_3c = local_3c ^ 1;
        goto LAB_00232571;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_002326af;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_44 = uVar3;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_002326bb:
      Abc_Print(-2,"usage: &bmci [-FWT num] [-svh]\n");
      Abc_Print(-2,"\t         experimental procedure\n");
      Abc_Print(-2,"\t-F num : the number of timeframes [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-W num : the number of machine words [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                (ulong)local_40);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_3c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggles using ternary simulation [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Bmci( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManBmciTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose );
    int c, nFrames = 1000, nWords = 1000, nTimeOut = 0, fSim = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 's':
            fSim ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): AIG is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vInitClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): Init array is not given.\n" );
        return 0;
    }
    Gia_ManBmciTest( pAbc->pGia, pAbc->pGia->vInitClasses, nFrames, nWords, nTimeOut, fSim, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmci [-FWT num] [-svh]\n" );
    Abc_Print( -2, "\t         experimental procedure\n" );
    Abc_Print( -2, "\t-F num : the number of timeframes [default = %d]\n",                    nFrames );
    Abc_Print( -2, "\t-W num : the number of machine words [default = %d]\n",                 nWords );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-s     : toggles using ternary simulation [default = %s]\n",            fSim?     "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",        fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}